

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.hh
# Opt level: O1

bool __thiscall OpenMesh::PolyConnectivity::is_boundary(PolyConnectivity *this,EdgeHandle _eh)

{
  Halfedge *pHVar1;
  bool bVar2;
  
  pHVar1 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,(HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2))
  ;
  if ((pHVar1->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1) {
    bVar2 = true;
  }
  else {
    pHVar1 = ArrayKernel::halfedge
                       (&this->super_ArrayKernel,
                        (HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2 | 1));
    bVar2 = (pHVar1->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ == -1;
  }
  return bVar2;
}

Assistant:

bool is_boundary(EdgeHandle _eh) const
  {
    return (is_boundary(halfedge_handle(_eh, 0)) ||
            is_boundary(halfedge_handle(_eh, 1)));
  }